

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O0

State __thiscall QAccessibleMdiSubWindow::state(QAccessibleMdiSubWindow *this)

{
  bool bVar1;
  byte bVar2;
  QWidget *pQVar3;
  QRect *pQVar4;
  long in_FS_OFFSET;
  QWidget *parent;
  State state;
  QWidget *in_stack_ffffffffffffffb0;
  QWidget *in_stack_ffffffffffffffb8;
  QRect local_20;
  State local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = (State)&DAT_aaaaaaaaaaaaaaaa;
  QAccessible::State::State((State *)0x7e496b);
  local_10 = (State)((ulong)local_10 & 0xfffffffffffffffb | 4);
  pQVar3 = &mdiSubWindow((QAccessibleMdiSubWindow *)0x7e4983)->super_QWidget;
  bVar1 = QWidget::isMaximized(pQVar3);
  if (!bVar1) {
    local_10 = (State)((ulong)local_10 & 0xffffffffffe7ffff | 0x180000);
  }
  mdiSubWindow((QAccessibleMdiSubWindow *)0x7e49bd);
  QApplication::focusWidget();
  bVar1 = QWidget::isAncestorOf(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (!bVar1) {
    in_stack_ffffffffffffffb8 = QApplication::focusWidget();
    pQVar3 = &mdiSubWindow((QAccessibleMdiSubWindow *)0x7e49ec)->super_QWidget;
    if (in_stack_ffffffffffffffb8 != pQVar3) goto LAB_007e4a07;
  }
  local_10 = (State)((ulong)local_10 & 0xfffffffffffffff7 | 8);
LAB_007e4a07:
  mdiSubWindow((QAccessibleMdiSubWindow *)0x7e4a11);
  bVar1 = QWidget::isVisible((QWidget *)0x7e4a19);
  if (!bVar1) {
    local_10 = (State)((ulong)local_10 & 0xfffffffffffdffff | 0x20000);
  }
  mdiSubWindow((QAccessibleMdiSubWindow *)0x7e4a39);
  pQVar3 = QWidget::parentWidget((QWidget *)0x7e4a41);
  if (pQVar3 != (QWidget *)0x0) {
    local_20 = QWidget::contentsRect(in_stack_ffffffffffffffb8);
    pQVar3 = &mdiSubWindow((QAccessibleMdiSubWindow *)0x7e4a6c)->super_QWidget;
    pQVar4 = QWidget::geometry(pQVar3);
    bVar2 = QRect::contains((QRect *)&local_20,SUB81(pQVar4,0));
    if (((bVar2 ^ 0xff) & 1) != 0) {
      local_10 = (State)((ulong)local_10 & 0xfffffffffffbffff | 0x40000);
    }
  }
  mdiSubWindow((QAccessibleMdiSubWindow *)0x7e4aa9);
  bVar1 = QWidget::isEnabled((QWidget *)0x7e4ab1);
  if (!bVar1) {
    local_10 = (State)((ulong)local_10 & 0xfffffffffffffffe | 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QAccessible::State QAccessibleMdiSubWindow::state() const
{
    QAccessible::State state;
    state.focusable = true;
    if (!mdiSubWindow()->isMaximized()) {
        state.movable = true;
        state.sizeable = true;
    }
    if (mdiSubWindow()->isAncestorOf(QApplication::focusWidget())
            || QApplication::focusWidget() == mdiSubWindow())
        state.focused = true;
    if (!mdiSubWindow()->isVisible())
        state.invisible = true;
    if (const QWidget *parent = mdiSubWindow()->parentWidget())
        if (!parent->contentsRect().contains(mdiSubWindow()->geometry()))
            state.offscreen = true;
    if (!mdiSubWindow()->isEnabled())
        state.disabled = true;
    return state;
}